

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

aphy_error aphyGetEngines(aphy_size numengines,aphy_engine **engines,aphy_size *ret_numengines)

{
  ref<aphy::engine> rVar1;
  Counter *in_RAX;
  ref<aphy::engine> local_18;
  
  if (ret_numengines != (aphy_size *)0x0) {
    *ret_numengines = 1;
  }
  if (numengines != 0 && engines != (aphy_engine **)0x0) {
    local_18.counter = in_RAX;
    aphy::makeObjectWithInterface<aphy::engine,APhyBullet::BulletEngine>();
    rVar1.counter = local_18.counter;
    local_18.counter = (Counter *)0x0;
    *engines = (aphy_engine *)rVar1.counter;
    aphy::ref<aphy::engine>::~ref(&local_18);
  }
  return APHY_OK;
}

Assistant:

APHY_EXPORT aphy_error aphyGetEngines ( aphy_size numengines, aphy_engine** engines, aphy_size* ret_numengines )
{
    using namespace aphy;
    using namespace APhyBullet;

    if(ret_numengines)
        *ret_numengines = 1;

    if(engines && numengines >= 1)
        engines[0] = reinterpret_cast<aphy_engine* > (makeObject<BulletEngine> ().disown());

    return APHY_OK;
}